

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case1118(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_503;
  allocator<char> local_502;
  allocator<char> local_501;
  string local_500;
  string local_4e0;
  string local_4c0 [32];
  Expectation local_4a0;
  Expectation local_3e8;
  Decl local_330;
  Decl local_268;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"int * * * x ; int y ;",&local_501);
  Expectation::Expectation(&local_4a0);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"x",&local_502);
  pDVar1 = Decl::Object(&local_1a0,&local_4e0,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_4a0,&local_d8);
  Decl::Decl(&local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"y",&local_503);
  __len = 0;
  pDVar1 = Decl::Object(&local_330,&local_500,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_268,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_268);
  Expectation::Expectation(&local_3e8,pEVar2);
  bind(this,(int)local_4c0,(sockaddr *)&local_3e8,__len);
  Expectation::~Expectation(&local_3e8);
  Decl::~Decl(&local_268);
  std::__cxx11::string::~string((string *)&local_500);
  Decl::~Decl(&local_330);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_4e0);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_4a0);
  std::__cxx11::string::~string(local_4c0);
  return;
}

Assistant:

void DeclarationBinderTester::case1118()
{
    bind("int * * * x ; int y ;",
         Expectation()
              .declaration(Decl()
                           .Object("x", SymbolKind::VariableDeclaration)
                           .ty_.Basic(BasicTypeKind::Int_S)
                           .ty_.Derived(TypeKind::Pointer)
                           .ty_.Derived(TypeKind::Pointer)
                           .ty_.Derived(TypeKind::Pointer))
              .declaration(Decl()
                           .Object("y", SymbolKind::VariableDeclaration)
                           .ty_.Basic(BasicTypeKind::Int_S)));
}